

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O2

void PMurHash32_Process(uint32_t *ph1,uint32_t *pcarry,void *key,int len)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  uint uVar9;
  
  uVar9 = *pcarry;
  uVar7 = *ph1;
  uVar5 = uVar9 & 3;
  uVar3 = -(int)key & 3;
  iVar6 = len - uVar3;
  if (len < (int)uVar3 || uVar3 == 0) {
LAB_0016393c:
    (*(code *)(&DAT_0017e2ac + *(int *)(&DAT_0017e2ac + (ulong)uVar5 * 4)))
              (ph1,pcarry,&DAT_0017e2ac + *(int *)(&DAT_0017e2ac + (ulong)uVar5 * 4),
               (long)(len / 4 << 2) + (long)key,len,uVar7);
    return;
  }
  pvVar8 = (void *)((ulong)(-(int)key & 3) + (long)key);
  do {
    lVar4 = 0;
    do {
      if (uVar3 == (uint)lVar4) {
        uVar5 = uVar5 + (uint)lVar4;
        key = pvVar8;
        len = iVar6;
        goto LAB_0016393c;
      }
      pbVar1 = (byte *)((long)key + lVar4);
      lVar4 = lVar4 + 1;
      uVar2 = uVar9 >> 8;
      uVar9 = uVar2 | (uint)*pbVar1 << 0x18;
    } while ((int)lVar4 + uVar5 != 4);
    uVar3 = uVar3 - (int)lVar4;
    key = (void *)((long)key + lVar4);
    uVar9 = (uVar9 * -0x3361d2af >> 0x11 | uVar2 * 0x16a88000) * 0x1b873593;
    uVar5 = 0;
    uVar7 = ((uVar7 ^ uVar9) >> 0x13 | (uVar7 ^ uVar9) << 0xd) * 5 + 0xe6546b64;
  } while( true );
}

Assistant:

void PMurHash32_Process(uint32_t *ph1, uint32_t *pcarry, const void *key, int len)
{
  uint32_t h1 = *ph1;
  uint32_t c = *pcarry;

  const uint8_t *ptr = (uint8_t*)key;
  const uint8_t *end;

  /* Extract carry count from low 2 bits of c value */
  int n = c & 3;

#if defined(UNALIGNED_SAFE)
  /* This CPU handles unaligned word access */

  /* Consume any carry bytes */
  int i = (4-n) & 3;
  if(i && i <= len) {
    DOBYTES(i, h1, c, n, ptr, len);
  }

  /* Process 32-bit chunks */
  end = ptr + len/4*4;
  for( ; ptr < end ; ptr+=4) {
    uint32_t k1 = READ_UINT32(ptr);
    DOBLOCK(h1, k1);
  }

#else /*UNALIGNED_SAFE*/
  /* This CPU does not handle unaligned word access */

  /* Consume enough so that the next data byte is word aligned */
  int i = -(intptr_t)ptr & 3;
  if(i && i <= len) {
      DOBYTES(i, h1, c, n, ptr, len);
  }

  /* We're now aligned. Process in aligned blocks. Specialise for each possible carry count */
  end = ptr + len/4*4;
  switch(n) { /* how many bytes in c */
  case 0: /* c=[----]  w=[3210]  b=[3210]=w            c'=[----] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = READ_UINT32(ptr);
      DOBLOCK(h1, k1);
    }
    break;
  case 1: /* c=[0---]  w=[4321]  b=[3210]=c>>24|w<<8   c'=[4---] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>24;
      c = READ_UINT32(ptr);
      k1 |= c<<8;
      DOBLOCK(h1, k1);
    }
    break;
  case 2: /* c=[10--]  w=[5432]  b=[3210]=c>>16|w<<16  c'=[54--] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>16;
      c = READ_UINT32(ptr);
      k1 |= c<<16;
      DOBLOCK(h1, k1);
    }
    break;
  case 3: /* c=[210-]  w=[6543]  b=[3210]=c>>8|w<<24   c'=[654-] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>8;
      c = READ_UINT32(ptr);
      k1 |= c<<24;
      DOBLOCK(h1, k1);
    }
  }
#endif /*UNALIGNED_SAFE*/

  /* Advance over whole 32-bit chunks, possibly leaving 1..3 bytes */
  len -= len/4*4;

  /* Append any remaining bytes into carry */
  DOBYTES(len, h1, c, n, ptr, len);

  /* Copy out new running hash and carry */
  *ph1 = h1;
  *pcarry = (c & ~0xff) | n;
}